

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_helpers.cpp
# Opt level: O2

QDebug * operator<<(QDebug *debug,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *vector)

{
  string *psVar1;
  QDebug *debug_00;
  string *str;
  string *s;
  
  psVar1 = *(string **)(vector + 8);
  for (s = *(string **)vector; s != psVar1; s = s + 1) {
    debug_00 = QDebug::operator<<(debug,"\n");
    operator<<(debug_00,s);
  }
  return debug;
}

Assistant:

QDebug &operator<<(QDebug &debug, const std::vector<std::string> &vector) {
  for (const std::string &str : vector) {
    debug << "\n" << str;
  }
  return debug;
}